

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O1

void aom_highbd_hadamard_8x8_c(int16_t *src_diff,ptrdiff_t src_stride,tran_low_t *coeff)

{
  short sVar1;
  ulong uVar2;
  short sVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  long lVar12;
  long lVar13;
  short sVar14;
  undefined1 (*pauVar15) [16];
  long lVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  int iVar24;
  int iVar29;
  int iVar30;
  undefined1 auVar25 [16];
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar47;
  int iVar48;
  int iVar50;
  undefined1 in_XMM2 [16];
  undefined1 auVar35 [16];
  undefined1 auVar38 [16];
  int iVar49;
  undefined1 auVar41 [16];
  undefined1 auVar44 [16];
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar60;
  int iVar61;
  undefined1 in_XMM4 [16];
  undefined1 auVar57 [16];
  int iVar62;
  int iVar63;
  int iVar68;
  int iVar69;
  undefined1 in_XMM5 [16];
  undefined1 auVar64 [16];
  int iVar70;
  undefined1 auVar67 [16];
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar83;
  int iVar84;
  undefined1 in_XMM8 [16];
  undefined1 auVar80 [16];
  int iVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  int iVar89;
  undefined8 uVar90;
  int16_t buffer [64];
  int32_t buffer2 [64];
  undefined8 uStack_1b8;
  short asStack_1b0 [4];
  ulong auStack_1a8 [14];
  undefined1 local_138 [264];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined2 uVar28;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  
  lVar16 = 0;
  do {
    lVar12 = src_stride * 4 + lVar16;
    sVar19 = *(short *)((long)src_diff + src_stride * 2 + lVar16);
    sVar20 = sVar19 + *(short *)((long)src_diff + lVar16);
    sVar19 = *(short *)((long)src_diff + lVar16) - sVar19;
    sVar22 = *(short *)((long)src_diff + src_stride * 4 + lVar16);
    sVar3 = *(short *)((long)src_diff + src_stride * 2 + lVar12);
    sVar23 = sVar3 + sVar22;
    sVar22 = sVar22 - sVar3;
    lVar12 = src_stride * 4 + lVar12;
    sVar21 = *(short *)((long)src_diff + src_stride * 8 + lVar16);
    lVar13 = src_stride * 2 + lVar12;
    sVar3 = *(short *)((long)src_diff + src_stride * 2 + lVar12);
    sVar17 = sVar3 + sVar21;
    sVar21 = sVar21 - sVar3;
    sVar18 = *(short *)((long)src_diff + src_stride * 2 + lVar13);
    sVar3 = *(short *)((long)src_diff + src_stride * 4 + lVar13);
    sVar14 = sVar3 + sVar18;
    sVar18 = sVar18 - sVar3;
    sVar3 = sVar20 + sVar23;
    sVar1 = sVar22 + sVar19;
    sVar20 = sVar20 - sVar23;
    sVar19 = sVar19 - sVar22;
    sVar22 = sVar14 + sVar17;
    sVar23 = sVar21 + sVar18;
    sVar17 = sVar17 - sVar14;
    sVar21 = sVar21 - sVar18;
    *(short *)(&uStack_1b8 + lVar16) = sVar22 + sVar3;
    *(short *)((long)auStack_1a8 + lVar16 * 8 + -2) = sVar1 + sVar23;
    asStack_1b0[lVar16 * 4 + -1] = sVar17 + sVar20;
    asStack_1b0[lVar16 * 4] = sVar21 + sVar19;
    asStack_1b0[lVar16 * 4 + -2] = sVar3 - sVar22;
    *(short *)((long)auStack_1a8 + lVar16 * 8 + -4) = sVar1 - sVar23;
    asStack_1b0[lVar16 * 4 + -3] = sVar20 - sVar17;
    *(short *)((long)auStack_1a8 + lVar16 * 8 + -6) = sVar19 - sVar21;
    lVar16 = lVar16 + 2;
  } while ((int)lVar16 != 0x10);
  pauVar15 = (undefined1 (*) [16])local_138;
  lVar16 = 0;
  do {
    uVar2 = *(ulong *)((long)&uStack_1b8 + lVar16 * 2);
    uVar28 = (undefined2)(uVar2 >> 0x30);
    auVar27._8_4_ = 0;
    auVar27._0_8_ = uVar2;
    auVar27._12_2_ = uVar28;
    auVar27._14_2_ = uVar28;
    uVar28 = (undefined2)(uVar2 >> 0x20);
    auVar26._12_4_ = auVar27._12_4_;
    auVar26._8_2_ = 0;
    auVar26._0_8_ = uVar2;
    auVar26._10_2_ = uVar28;
    auVar25._10_6_ = auVar26._10_6_;
    auVar25._8_2_ = uVar28;
    auVar25._0_8_ = uVar2;
    uVar28 = (undefined2)(uVar2 >> 0x10);
    auVar4._4_8_ = auVar25._8_8_;
    auVar4._2_2_ = uVar28;
    auVar4._0_2_ = uVar28;
    iVar29 = auVar4._0_4_ >> 0x10;
    iVar30 = auVar25._8_4_ >> 0x10;
    uVar90 = *(undefined8 *)((long)auStack_1a8 + lVar16 * 2);
    auVar37._0_12_ = in_XMM2._0_12_;
    auVar37._12_2_ = in_XMM2._6_2_;
    auVar37._14_2_ = (short)((ulong)uVar90 >> 0x30);
    auVar36._12_4_ = auVar37._12_4_;
    auVar36._0_10_ = in_XMM2._0_10_;
    auVar36._10_2_ = (short)((ulong)uVar90 >> 0x20);
    auVar35._10_6_ = auVar36._10_6_;
    auVar35._0_8_ = in_XMM2._0_8_;
    auVar35._8_2_ = in_XMM2._4_2_;
    auVar5._4_8_ = auVar35._8_8_;
    auVar5._2_2_ = (short)((ulong)uVar90 >> 0x10);
    auVar5._0_2_ = in_XMM2._2_2_;
    iVar47 = auVar5._0_4_ >> 0x10;
    iVar48 = auVar35._8_4_ >> 0x10;
    iVar31 = (int)(short)uVar90 + (int)(short)uVar2;
    iVar32 = iVar47 + iVar29;
    iVar33 = iVar48 + iVar30;
    iVar34 = (auVar36._12_4_ >> 0x10) + (auVar26._12_4_ >> 0x10);
    iVar24 = (int)(short)uVar2 - (int)(short)uVar90;
    iVar29 = iVar29 - iVar47;
    iVar30 = iVar30 - iVar48;
    iVar47 = (auVar26._12_4_ >> 0x10) - (auVar36._12_4_ >> 0x10);
    uVar90 = *(undefined8 *)((long)auStack_1a8 + lVar16 * 2 + 0x10);
    auVar66._0_12_ = in_XMM5._0_12_;
    auVar66._12_2_ = in_XMM5._6_2_;
    auVar66._14_2_ = (short)((ulong)uVar90 >> 0x30);
    auVar65._12_4_ = auVar66._12_4_;
    auVar65._0_10_ = in_XMM5._0_10_;
    auVar65._10_2_ = (short)((ulong)uVar90 >> 0x20);
    auVar64._10_6_ = auVar65._10_6_;
    auVar64._0_8_ = in_XMM5._0_8_;
    auVar64._8_2_ = in_XMM5._4_2_;
    auVar6._4_8_ = auVar64._8_8_;
    auVar6._2_2_ = (short)((ulong)uVar90 >> 0x10);
    auVar6._0_2_ = in_XMM5._2_2_;
    iVar68 = auVar6._0_4_ >> 0x10;
    iVar69 = auVar64._8_4_ >> 0x10;
    uVar2 = *(ulong *)((long)auStack_1a8 + lVar16 * 2 + 0x20);
    uVar28 = (undefined2)(uVar2 >> 0x30);
    auVar40._8_4_ = 0;
    auVar40._0_8_ = uVar2;
    auVar40._12_2_ = uVar28;
    auVar40._14_2_ = uVar28;
    uVar28 = (undefined2)(uVar2 >> 0x20);
    auVar39._12_4_ = auVar40._12_4_;
    auVar39._8_2_ = 0;
    auVar39._0_8_ = uVar2;
    auVar39._10_2_ = uVar28;
    auVar38._10_6_ = auVar39._10_6_;
    auVar38._8_2_ = uVar28;
    auVar38._0_8_ = uVar2;
    uVar28 = (undefined2)(uVar2 >> 0x10);
    auVar7._4_8_ = auVar38._8_8_;
    auVar7._2_2_ = uVar28;
    auVar7._0_2_ = uVar28;
    iVar48 = auVar7._0_4_ >> 0x10;
    iVar49 = auVar38._8_4_ >> 0x10;
    iVar75 = (int)(short)uVar2 + (int)(short)uVar90;
    iVar76 = iVar48 + iVar68;
    iVar77 = iVar49 + iVar69;
    iVar78 = (auVar39._12_4_ >> 0x10) + (auVar65._12_4_ >> 0x10);
    iVar63 = (int)(short)uVar90 - (int)(short)uVar2;
    iVar68 = iVar68 - iVar48;
    iVar69 = iVar69 - iVar49;
    iVar70 = (auVar65._12_4_ >> 0x10) - (auVar39._12_4_ >> 0x10);
    uVar90 = *(undefined8 *)((long)auStack_1a8 + lVar16 * 2 + 0x30);
    auVar59._0_12_ = in_XMM4._0_12_;
    auVar59._12_2_ = in_XMM4._6_2_;
    auVar59._14_2_ = (short)((ulong)uVar90 >> 0x30);
    auVar58._12_4_ = auVar59._12_4_;
    auVar58._0_10_ = in_XMM4._0_10_;
    auVar58._10_2_ = (short)((ulong)uVar90 >> 0x20);
    auVar57._10_6_ = auVar58._10_6_;
    auVar57._0_8_ = in_XMM4._0_8_;
    auVar57._8_2_ = in_XMM4._4_2_;
    auVar8._4_8_ = auVar57._8_8_;
    auVar8._2_2_ = (short)((ulong)uVar90 >> 0x10);
    auVar8._0_2_ = in_XMM4._2_2_;
    iVar60 = auVar8._0_4_ >> 0x10;
    iVar61 = auVar57._8_4_ >> 0x10;
    uVar2 = *(ulong *)(local_138 + lVar16 * 2 + -0x30);
    uVar28 = (undefined2)(uVar2 >> 0x30);
    auVar43._8_4_ = 0;
    auVar43._0_8_ = uVar2;
    auVar43._12_2_ = uVar28;
    auVar43._14_2_ = uVar28;
    uVar28 = (undefined2)(uVar2 >> 0x20);
    auVar42._12_4_ = auVar43._12_4_;
    auVar42._8_2_ = 0;
    auVar42._0_8_ = uVar2;
    auVar42._10_2_ = uVar28;
    auVar41._10_6_ = auVar42._10_6_;
    auVar41._8_2_ = uVar28;
    auVar41._0_8_ = uVar2;
    uVar28 = (undefined2)(uVar2 >> 0x10);
    auVar9._4_8_ = auVar41._8_8_;
    auVar9._2_2_ = uVar28;
    auVar9._0_2_ = uVar28;
    iVar48 = auVar9._0_4_ >> 0x10;
    iVar49 = auVar41._8_4_ >> 0x10;
    iVar71 = (int)(short)uVar2 + (int)(short)uVar90;
    iVar72 = iVar48 + iVar60;
    iVar73 = iVar49 + iVar61;
    iVar74 = (auVar42._12_4_ >> 0x10) + (auVar58._12_4_ >> 0x10);
    iVar56 = (int)(short)uVar90 - (int)(short)uVar2;
    iVar60 = iVar60 - iVar48;
    iVar61 = iVar61 - iVar49;
    iVar62 = (auVar58._12_4_ >> 0x10) - (auVar42._12_4_ >> 0x10);
    uVar90 = *(undefined8 *)(local_138 + lVar16 * 2 + -0x20);
    auVar82._0_12_ = in_XMM8._0_12_;
    auVar82._12_2_ = in_XMM8._6_2_;
    auVar82._14_2_ = (short)((ulong)uVar90 >> 0x30);
    auVar81._12_4_ = auVar82._12_4_;
    auVar81._0_10_ = in_XMM8._0_10_;
    auVar81._10_2_ = (short)((ulong)uVar90 >> 0x20);
    auVar80._10_6_ = auVar81._10_6_;
    auVar80._0_8_ = in_XMM8._0_8_;
    auVar80._8_2_ = in_XMM8._4_2_;
    auVar10._4_8_ = auVar80._8_8_;
    auVar10._2_2_ = (short)((ulong)uVar90 >> 0x10);
    auVar10._0_2_ = in_XMM8._2_2_;
    iVar83 = auVar10._0_4_ >> 0x10;
    iVar84 = auVar80._8_4_ >> 0x10;
    uVar2 = *(ulong *)(local_138 + lVar16 * 2 + -0x10);
    uVar28 = (undefined2)(uVar2 >> 0x30);
    auVar46._8_4_ = 0;
    auVar46._0_8_ = uVar2;
    auVar46._12_2_ = uVar28;
    auVar46._14_2_ = uVar28;
    uVar28 = (undefined2)(uVar2 >> 0x20);
    auVar45._12_4_ = auVar46._12_4_;
    auVar45._8_2_ = 0;
    auVar45._0_8_ = uVar2;
    auVar45._10_2_ = uVar28;
    auVar44._10_6_ = auVar45._10_6_;
    auVar44._8_2_ = uVar28;
    auVar44._0_8_ = uVar2;
    uVar28 = (undefined2)(uVar2 >> 0x10);
    auVar11._4_8_ = auVar44._8_8_;
    auVar11._2_2_ = uVar28;
    auVar11._0_2_ = uVar28;
    iVar48 = auVar11._0_4_ >> 0x10;
    iVar49 = auVar44._8_4_ >> 0x10;
    iVar86 = (int)(short)uVar2 + (int)(short)uVar90;
    iVar87 = iVar48 + iVar83;
    iVar88 = iVar49 + iVar84;
    iVar89 = (auVar45._12_4_ >> 0x10) + (auVar81._12_4_ >> 0x10);
    iVar79 = (int)(short)uVar90 - (int)(short)uVar2;
    iVar83 = iVar83 - iVar48;
    iVar84 = iVar84 - iVar49;
    iVar85 = (auVar81._12_4_ >> 0x10) - (auVar45._12_4_ >> 0x10);
    iVar48 = iVar75 + iVar31;
    iVar49 = iVar76 + iVar32;
    iVar50 = iVar77 + iVar33;
    iVar51 = iVar78 + iVar34;
    iVar52 = iVar63 + iVar24;
    iVar53 = iVar68 + iVar29;
    iVar54 = iVar69 + iVar30;
    iVar55 = iVar70 + iVar47;
    iVar31 = iVar31 - iVar75;
    iVar32 = iVar32 - iVar76;
    iVar33 = iVar33 - iVar77;
    iVar34 = iVar34 - iVar78;
    iVar24 = iVar24 - iVar63;
    iVar29 = iVar29 - iVar68;
    iVar30 = iVar30 - iVar69;
    iVar47 = iVar47 - iVar70;
    iVar63 = iVar86 + iVar71;
    iVar68 = iVar87 + iVar72;
    iVar69 = iVar88 + iVar73;
    iVar70 = iVar89 + iVar74;
    iVar75 = iVar79 + iVar56;
    iVar76 = iVar83 + iVar60;
    iVar77 = iVar84 + iVar61;
    iVar78 = iVar85 + iVar62;
    iVar71 = iVar71 - iVar86;
    iVar72 = iVar72 - iVar87;
    iVar73 = iVar73 - iVar88;
    iVar74 = iVar74 - iVar89;
    iVar56 = iVar56 - iVar79;
    iVar60 = iVar60 - iVar83;
    iVar61 = iVar61 - iVar84;
    iVar62 = iVar62 - iVar85;
    in_XMM8._0_4_ = iVar75 + iVar52;
    in_XMM8._4_4_ = iVar76 + iVar53;
    in_XMM8._8_4_ = iVar77 + iVar54;
    in_XMM8._12_4_ = iVar78 + iVar55;
    in_XMM4._12_4_ = iVar71 + iVar31;
    in_XMM4._8_4_ = iVar48 - iVar63;
    in_XMM4._4_4_ = iVar31 - iVar71;
    in_XMM4._0_4_ = iVar63 + iVar48;
    uVar90 = CONCAT44(in_XMM8._0_4_,iVar52 - iVar75);
    in_XMM2._0_8_ = CONCAT44(iVar73 + iVar33,iVar50 - iVar69);
    in_XMM2._8_4_ = iVar51 - iVar70;
    in_XMM2._12_4_ = iVar74 + iVar34;
    auVar67._0_8_ = CONCAT44(iVar33 - iVar73,iVar69 + iVar50);
    auVar67._8_4_ = iVar70 + iVar51;
    auVar67._12_4_ = iVar34 - iVar74;
    in_XMM5._8_8_ = in_XMM2._8_8_;
    in_XMM5._0_8_ = auVar67._8_8_;
    *(int *)(pauVar15[7] + 8) = iVar62 + iVar47;
    *(int *)(pauVar15[7] + 0xc) = iVar47 - iVar62;
    *(int *)pauVar15[8] = iVar55 - iVar78;
    *(int *)(pauVar15[8] + 4) = in_XMM8._12_4_;
    pauVar15[6] = in_XMM5;
    *(int *)pauVar15[5] = iVar61 + iVar30;
    *(int *)(pauVar15[5] + 4) = iVar30 - iVar61;
    *(int *)(pauVar15[5] + 8) = iVar54 - iVar77;
    *(int *)(pauVar15[5] + 0xc) = in_XMM8._8_4_;
    *(undefined8 *)pauVar15[4] = auVar67._0_8_;
    *(undefined8 *)(pauVar15[4] + 8) = in_XMM2._0_8_;
    *(int *)(pauVar15[3] + 8) = iVar60 + iVar29;
    *(int *)(pauVar15[3] + 0xc) = iVar29 - iVar60;
    *(int *)pauVar15[4] = iVar53 - iVar76;
    *(int *)(pauVar15[4] + 4) = in_XMM8._4_4_;
    *(int *)(pauVar15[2] + 8) = iVar68 + iVar49;
    *(int *)(pauVar15[2] + 0xc) = iVar32 - iVar72;
    *(int *)pauVar15[3] = iVar49 - iVar68;
    *(int *)(pauVar15[3] + 4) = iVar72 + iVar32;
    *(ulong *)pauVar15[1] = CONCAT44(iVar24 - iVar56,iVar56 + iVar24);
    *(undefined8 *)(pauVar15[1] + 8) = uVar90;
    *pauVar15 = in_XMM4;
    lVar16 = lVar16 + 4;
    pauVar15 = pauVar15 + 8;
  } while (lVar16 != 8);
  memcpy(coeff,local_138,0x100);
  return;
}

Assistant:

void aom_highbd_hadamard_8x8_c(const int16_t *src_diff, ptrdiff_t src_stride,
                               tran_low_t *coeff) {
  int idx;
  int16_t buffer[64];
  int32_t buffer2[64];
  int16_t *tmp_buf = &buffer[0];
  for (idx = 0; idx < 8; ++idx) {
    // src_diff: 13 bit
    // buffer: 16 bit, dynamic range [-32760, 32760]
    hadamard_highbd_col8_first_pass(src_diff, src_stride, tmp_buf);
    tmp_buf += 8;
    ++src_diff;
  }

  tmp_buf = &buffer[0];
  for (idx = 0; idx < 8; ++idx) {
    // buffer: 16 bit
    // buffer2: 19 bit, dynamic range [-262080, 262080]
    hadamard_highbd_col8_second_pass(tmp_buf, 8, buffer2 + 8 * idx);
    ++tmp_buf;
  }

  for (idx = 0; idx < 64; ++idx) coeff[idx] = (tran_low_t)buffer2[idx];
}